

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O2

WORD32 ihevc_buf_mgr_release(buf_mgr_t *ps_buf_mgr,WORD32 buf_id,UWORD32 mask)

{
  uint uVar1;
  
  if ((int)ps_buf_mgr->u4_max_buf_cnt <= buf_id) {
    return -1;
  }
  uVar1 = ~mask & ps_buf_mgr->au4_status[buf_id];
  ps_buf_mgr->au4_status[buf_id] = uVar1;
  if (uVar1 != 1) {
    if (uVar1 != 2) {
      return 0;
    }
    __assert_fail("(ps_buf_mgr->au4_status[buf_id] != 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                  ,0x109,"WORD32 ihevc_buf_mgr_release(buf_mgr_t *, WORD32, UWORD32)");
  }
  ps_buf_mgr->au4_status[buf_id] = 0;
  return 0;
}

Assistant:

WORD32 ihevc_buf_mgr_release(
                buf_mgr_t *ps_buf_mgr,
                WORD32 buf_id,
                UWORD32 mask)
{
    /* If the given id is pointing to an id which is not yet added */
    if(buf_id >= (WORD32)ps_buf_mgr->u4_max_buf_cnt)
    {
        return (-1);
    }

    ps_buf_mgr->au4_status[buf_id] &= ~mask;
    ASSERT(ps_buf_mgr->au4_status[buf_id] != 2);

    /* If both the REF and DISP are zero, DEC is set to zero */
    if(ps_buf_mgr->au4_status[buf_id] == 1)
    {
        ps_buf_mgr->au4_status[buf_id] = 0;
    }

    return 0;
}